

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O3

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry
          (Status *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer,
          PointCloud *out_geometry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_> this_00;
  Status *_local_status;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  _statusor115;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
  local_a8;
  DracoHeader local_74;
  DecoderBuffer local_68;
  
  local_68.bit_mode_ = in_buffer->bit_mode_;
  local_68._49_1_ = in_buffer->field_0x31;
  local_68.bitstream_version_ = in_buffer->bitstream_version_;
  local_68._52_4_ = *(undefined4 *)&in_buffer->field_0x34;
  local_68.data_ = in_buffer->data_;
  local_68.data_size_ = in_buffer->data_size_;
  local_68.pos_ = in_buffer->pos_;
  local_68.bit_decoder_.bit_buffer_ = (in_buffer->bit_decoder_).bit_buffer_;
  local_68.bit_decoder_.bit_buffer_end_ = (in_buffer->bit_decoder_).bit_buffer_end_;
  local_68.bit_decoder_.bit_offset_ = (in_buffer->bit_decoder_).bit_offset_;
  PointCloudDecoder::DecodeHeader(__return_storage_ptr__,&local_68,&local_74);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar3 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    psVar2 = &__return_storage_ptr__->error_msg_;
    if (local_74.encoder_type == '\0') {
      CreatePointCloudDecoder(&local_a8,local_74.encoder_method);
      this_00._M_t.
      super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
      .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>,_true,_true>
            )(__uniq_ptr_data<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>,_true,_true>
              )local_a8.value_;
      if (local_a8.status_.code_ == OK) {
        local_a8.value_._M_t.
        super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
        .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>,_true,_true>
              )(__uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                )0x0;
        PointCloudDecoder::DecodeStep1
                  (__return_storage_ptr__,
                   (PointCloudDecoder *)
                   this_00._M_t.
                   super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
                   .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl,
                   &this->options_,in_buffer,out_geometry);
        if (__return_storage_ptr__->code_ == OK) {
          pcVar3 = (psVar2->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          PointCloudDecoder::DecodeStep2
                    (__return_storage_ptr__,
                     (PointCloudDecoder *)
                     this_00._M_t.
                     super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
                     .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl);
          if (__return_storage_ptr__->code_ == OK) {
            pcVar3 = (psVar2->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            __return_storage_ptr__->code_ = OK;
            (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
            (__return_storage_ptr__->error_msg_)._M_string_length = 0;
            (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
          }
        }
        (*(*(_func_int ***)
            this_00._M_t.
            super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
            .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl)[1])
                  (this_00._M_t.
                   super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
                   .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl);
      }
      else {
        __return_storage_ptr__->code_ = local_a8.status_.code_;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar2,local_a8.status_.error_msg_._M_dataplus._M_p,
                   local_a8.status_.error_msg_._M_dataplus._M_p +
                   local_a8.status_.error_msg_._M_string_length);
      }
      if ((_Head_base<0UL,_draco::PointCloudDecoder_*,_false>)
          local_a8.value_._M_t.
          super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
          ._M_t.
          super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
          .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl !=
          (_Head_base<0UL,_draco::PointCloudDecoder_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_a8.value_._M_t.
            super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
            .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl)[1])();
      }
      local_a8.value_._M_t.
      super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
      .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>,_true,_true>
            )(__uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
              )0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.status_.error_msg_._M_dataplus._M_p == &local_a8.status_.error_msg_.field_2)
      goto LAB_0011dce9;
    }
    else {
      local_a8.status_._0_8_ = (pointer)((long)&local_a8 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Input is not a point cloud.","");
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar2,local_a8.status_._0_8_,
                 local_a8.status_.error_msg_._M_dataplus._M_p + local_a8.status_._0_8_);
      local_a8.status_.error_msg_.field_2._M_allocated_capacity =
           local_a8.status_.error_msg_._M_string_length;
      local_a8.status_.error_msg_._M_dataplus._M_p = (pointer)local_a8.status_._0_8_;
      if ((pointer)local_a8.status_._0_8_ == (pointer)((long)&local_a8 + 0x10U)) goto LAB_0011dce9;
    }
    operator_delete(local_a8.status_.error_msg_._M_dataplus._M_p,
                    local_a8.status_.error_msg_.field_2._M_allocated_capacity + 1);
  }
LAB_0011dce9:
  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       PointCloud *out_geometry) {
#ifdef DRACO_POINT_CLOUD_COMPRESSION_SUPPORTED
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header))
  if (header.encoder_type != POINT_CLOUD) {
    return Status(Status::DRACO_ERROR, "Input is not a point cloud.");
  }
  DRACO_ASSIGN_OR_RETURN(std::unique_ptr<PointCloudDecoder> decoder,
                         CreatePointCloudDecoder(header.encoder_method))

  DRACO_RETURN_IF_ERROR(decoder->DecodeStep1(options_, in_buffer, out_geometry))
  DRACO_RETURN_IF_ERROR(decoder->DecodeStep2())
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}